

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::BreakStmt::set_parent(BreakStmt *this,IRNode *parent)

{
  int iVar1;
  Stmt *s;
  undefined4 extraout_var;
  UserException *this_00;
  IRNode *pIVar3;
  string local_40;
  IRNode *pIVar2;
  
  if (parent != (IRNode *)0x0) {
    pIVar2 = parent;
    do {
      if ((pIVar2->ast_node_type_ == StmtKind) &&
         (pIVar3 = pIVar2,
         *(int *)&pIVar2[1].fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish == 2)) break;
      iVar1 = (*pIVar2->_vptr_IRNode[4])(pIVar2);
      pIVar2 = (IRNode *)CONCAT44(extraout_var,iVar1);
      pIVar3 = (IRNode *)0x0;
    } while (pIVar2 != (IRNode *)0x0);
    if (pIVar3 != (IRNode *)0x0) {
      (this->super_Stmt).parent_ = parent;
      return;
    }
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Break statement not allowed outside loop","");
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BreakStmt::set_parent(IRNode *parent) {
    // making sure we are inside a for loop
    Stmt *for_ = nullptr;
    auto *p = parent;
    while (p) {
        if (p->ir_node_kind() == IRNodeKind::StmtKind) {
            auto *s = reinterpret_cast<Stmt *>(p);
            if (s->type() == StatementType::For) {
                for_ = s;
                break;
            }
        }
        p = p->parent();
    }
    if (for_ == nullptr) {
        throw UserException("Break statement not allowed outside loop");
    }
    Stmt::set_parent(parent);
}